

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_scalar_split(secp256k1_scalar *full)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  secp256k1_scalar *psVar7;
  int extraout_EDX;
  size_t n_pubkeys;
  secp256k1_scalar *seckey;
  uint uVar8;
  ulong uVar9;
  uchar *p2;
  secp256k1_ge *pubkey;
  secp256k1_scalar *psVar10;
  secp256k1_ge *ge;
  secp256k1_scalar *psVar11;
  secp256k1_scalar *psVar12;
  secp256k1_context *psVar13;
  secp256k1_context *psVar14;
  int *in_R8;
  byte bVar15;
  secp256k1_ge *pubkey_00;
  secp256k1_ge *output;
  secp256k1_ge *output_00;
  uint uVar16;
  uchar tmp [32];
  uchar zero [32];
  secp256k1_scalar slam;
  secp256k1_scalar s1;
  secp256k1_scalar s;
  secp256k1_scalar sStack_338;
  secp256k1_ge *psStack_310;
  secp256k1_ge *psStack_308;
  secp256k1_context *psStack_300;
  secp256k1_ge *psStack_2f8;
  secp256k1_ge *psStack_2f0;
  secp256k1_scalar sStack_2e8;
  ulong uStack_2c0;
  secp256k1_scalar *psStack_2b8;
  bool bStack_2a9;
  undefined8 uStack_2a8;
  undefined1 auStack_2a0 [65];
  char acStack_25f [7];
  secp256k1_ge *psStack_258;
  uint64_t uStack_250;
  undefined8 uStack_248;
  undefined8 uStack_240;
  undefined8 uStack_238;
  size_t sStack_210;
  int iStack_208;
  uint uStack_204;
  secp256k1_scalar *psStack_200;
  ulong uStack_1f8;
  undefined1 auStack_1f0 [105];
  uint64_t uStack_187;
  uint64_t uStack_17f;
  uint64_t uStack_177;
  secp256k1_ge sStack_160;
  secp256k1_scalar *psStack_f8;
  secp256k1_scalar *psStack_f0;
  secp256k1_scalar local_c8;
  char local_a8 [40];
  secp256k1_scalar local_80;
  secp256k1_scalar local_60;
  secp256k1_scalar local_40;
  secp256k1_ge *psVar17;
  
  psVar12 = &local_c8;
  psVar7 = &local_c8;
  local_a8[0x10] = '\0';
  local_a8[0x11] = '\0';
  local_a8[0x12] = '\0';
  local_a8[0x13] = '\0';
  local_a8[0x14] = '\0';
  local_a8[0x15] = '\0';
  local_a8[0x16] = '\0';
  local_a8[0x17] = '\0';
  local_a8[0x18] = '\0';
  local_a8[0x19] = '\0';
  local_a8[0x1a] = '\0';
  local_a8[0x1b] = '\0';
  local_a8[0x1c] = '\0';
  local_a8[0x1d] = '\0';
  local_a8[0x1e] = '\0';
  local_a8[0x1f] = '\0';
  local_a8[0] = '\0';
  local_a8[1] = '\0';
  local_a8[2] = '\0';
  local_a8[3] = '\0';
  local_a8[4] = '\0';
  local_a8[5] = '\0';
  local_a8[6] = '\0';
  local_a8[7] = '\0';
  local_a8[8] = '\0';
  local_a8[9] = '\0';
  local_a8[10] = '\0';
  local_a8[0xb] = '\0';
  local_a8[0xc] = '\0';
  local_a8[0xd] = '\0';
  local_a8[0xe] = '\0';
  local_a8[0xf] = '\0';
  secp256k1_scalar_split_lambda(&local_60,&local_80,full);
  psVar11 = &local_40;
  secp256k1_scalar_mul(psVar11,&secp256k1_const_lambda,&local_80);
  psVar10 = psVar11;
  secp256k1_scalar_add(psVar11,psVar11,&local_60);
  iVar4 = (int)psVar10;
  secp256k1_scalar_verify(psVar11);
  psVar10 = full;
  secp256k1_scalar_verify(full);
  if ((((local_40.d[0] == full->d[0]) && (local_40.d[1] == full->d[1])) &&
      (local_40.d[2] == full->d[2])) && (local_40.d[3] == full->d[3])) {
    iVar4 = secp256k1_scalar_is_high(&local_60);
    if (iVar4 != 0) {
      secp256k1_scalar_negate(&local_60,&local_60);
    }
    iVar4 = secp256k1_scalar_is_high(&local_80);
    if (iVar4 != 0) {
      secp256k1_scalar_negate(&local_80,&local_80);
    }
    psVar10 = &local_60;
    secp256k1_scalar_get_b32((uchar *)&local_c8,psVar10);
    iVar4 = (int)psVar10;
    lVar5 = 0;
    do {
      psVar10 = psVar12;
      if (local_a8[lVar5] != *(char *)((long)local_c8.d + lVar5)) goto LAB_00150fb0;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x10);
    psVar10 = &local_80;
    secp256k1_scalar_get_b32((uchar *)&local_c8,psVar10);
    iVar4 = (int)psVar10;
    lVar5 = 0;
    while (local_a8[lVar5] == *(char *)((long)local_c8.d + lVar5)) {
      lVar5 = lVar5 + 1;
      if (lVar5 == 0x10) {
        return;
      }
    }
  }
  else {
    test_scalar_split_cold_3();
LAB_00150fb0:
    psVar7 = psVar10;
    test_scalar_split_cold_1();
  }
  test_scalar_split_cold_2();
  psStack_f0 = psVar11;
  psStack_f8 = full;
  iStack_208 = extraout_EDX;
  auStack_2a0._60_4_ = iVar4;
  sStack_210 = 3;
  psStack_200 = psVar7;
  do {
    uStack_17f = psVar7[1].d[2];
    uStack_177 = psVar7[1].d[3];
    auStack_1f0._97_8_ = psVar7[1].d[0];
    uStack_187 = psVar7[1].d[1];
    auStack_1f0._81_8_ = psVar7->d[2];
    auStack_1f0._89_8_ = psVar7->d[3];
    auStack_1f0._65_8_ = psVar7->d[0];
    auStack_1f0._73_8_ = psVar7->d[1];
    stack0xfffffffffffffda0 = (_func_void_char_ptr_void_ptr *)0x4d430001;
    psStack_258 = (secp256k1_ge *)(auStack_1f0 + sStack_210 + 0x40);
    lVar5 = sStack_210 - 0x41;
    uStack_250 = -lVar5;
    uStack_248._0_4_ = 0;
    uStack_248._4_4_ = 0;
    uStack_240._0_4_ = 0;
    uStack_240._4_4_ = 0;
    uStack_238 = 0;
    auStack_2a0._0_8_ = 0;
    bStack_2a9 = auStack_2a0._60_4_ != 0 && sStack_210 == 0x21;
    uStack_204 = (uint)(lVar5 == 0) * 4;
    uStack_1f8 = (ulong)(lVar5 == 0 || sStack_210 == 0x21);
    uVar9 = 0;
    do {
      output = (secp256k1_ge *)(auStack_2a0 + 0x40);
      pubkey = (secp256k1_ge *)0x0;
      auStack_1f0[0x40] = (char)uVar9;
      uVar8 = (uint)uVar9;
      uVar16 = *(byte *)((long)psVar7[1].d + 0x1f) & 1 | 2;
      psVar17 = (secp256k1_ge *)(ulong)uVar16;
      if ((auStack_2a0._60_4_ == 0 || iStack_208 == 0) || (uVar8 & 4) != uStack_204) {
        pubkey_00 = (secp256k1_ge *)0x0;
      }
      else {
        pubkey_00 = (secp256k1_ge *)
                    CONCAT71((int7)((ulong)psVar11 >> 8),
                             ((uVar8 & 0xfb) == uVar16 || uVar8 == 4) & (byte)uStack_1f8);
      }
      bVar15 = (byte)pubkey_00;
      psVar13 = CTX;
      if (((bStack_2a9 != false && (uVar8 & 0xfe) == 2) | bVar15) != 1) {
        auStack_1f0._48_8_ = 0xfefefefefefefefe;
        auStack_1f0._56_8_ = 0xfefefefefefefefe;
        auStack_1f0._32_8_ = 0xfefefefefefefefe;
        auStack_1f0._40_4_ = -0x1010102;
        auStack_1f0._44_4_ = -0x1010102;
        auStack_1f0._16_8_ = 0xfefefefefefefefe;
        auStack_1f0._24_8_ = 0xfefefefefefefefe;
        auStack_1f0._0_8_ = 0xfefefefefefefefe;
        auStack_1f0._8_8_ = 0xfefefefefefefefe;
        stack0xfffffffffffffda0 = (_func_void_char_ptr_void_ptr *)0x4d430001;
        pubkey_00 = (secp256k1_ge *)auStack_1f0;
        uStack_250 = 0x40;
        uStack_248._0_4_ = 0;
        uStack_248._4_4_ = 0;
        uStack_240._0_4_ = 0;
        uStack_240._4_4_ = 0;
        uStack_238 = 0;
        auStack_2a0._0_8_ = 0;
        psStack_2b8 = (secp256k1_scalar *)0x1515bf;
        ge = pubkey_00;
        psStack_258 = pubkey_00;
        iVar4 = secp256k1_ec_pubkey_parse
                          (CTX,(secp256k1_pubkey *)pubkey_00,auStack_1f0 + 0x40,sStack_210);
        psVar14 = CTX;
        if (iVar4 != 0) {
          psStack_2b8 = (secp256k1_scalar *)0x1516e0;
          ec_pubkey_parse_pointtest_cold_1();
          goto LAB_001516e0;
        }
        uStack_250 = 0x40;
        uStack_248._0_4_ = 0;
        uStack_248._4_4_ = 0;
        uStack_240._0_4_ = 0;
        uStack_240._4_4_ = 0;
        uStack_238 = 0;
        auStack_2a0._0_8_ = 0;
        unique0x10000a17 = (CTX->illegal_callback).fn;
        psStack_258 = (secp256k1_ge *)(CTX->illegal_callback).data;
        if (secp256k1_context_static == CTX) {
          psStack_2b8 = (secp256k1_scalar *)0x1516b3;
          (*(CTX->illegal_callback).fn)
                    ("ctx != secp256k1_context_static",(CTX->illegal_callback).data);
          psVar13 = CTX;
        }
        else {
          (CTX->illegal_callback).fn = counting_callback_fn;
          (psVar14->illegal_callback).data = auStack_2a0;
          psVar13 = psVar14;
        }
        ge = &sStack_160;
        psStack_2b8 = (secp256k1_scalar *)0x151660;
        iVar4 = secp256k1_pubkey_load(psVar13,ge,(secp256k1_pubkey *)pubkey_00);
        psVar14 = CTX;
        if (iVar4 != 0) goto LAB_001516ea;
        (CTX->illegal_callback).fn = stack0xfffffffffffffda0;
        (psVar14->illegal_callback).data = psStack_258;
        if (auStack_2a0._0_4_ == 1) goto LAB_0015168f;
LAB_001516ef:
        psStack_2b8 = (secp256k1_scalar *)0x1516f4;
        ec_pubkey_parse_pointtest_cold_3();
        psVar11 = psVar7;
LAB_001516f4:
        psVar7 = psVar11;
        psStack_2b8 = (secp256k1_scalar *)0x1516f9;
        ec_pubkey_parse_pointtest_cold_4();
LAB_001516f9:
        psStack_2b8 = (secp256k1_scalar *)0x1516fe;
        ec_pubkey_parse_pointtest_cold_12();
LAB_001516fe:
        psStack_2b8 = (secp256k1_scalar *)0x151703;
        ec_pubkey_parse_pointtest_cold_6();
        output_00 = psVar17;
LAB_00151703:
        psStack_2b8 = (secp256k1_scalar *)0x151708;
        ec_pubkey_parse_pointtest_cold_11();
LAB_00151708:
        psStack_2b8 = (secp256k1_scalar *)0x15170d;
        ec_pubkey_parse_pointtest_cold_10();
LAB_0015170d:
        psStack_2b8 = (secp256k1_scalar *)0x151712;
        ec_pubkey_parse_pointtest_cold_7();
        psVar17 = output_00;
LAB_00151712:
        psStack_2b8 = (secp256k1_scalar *)0x151717;
        ec_pubkey_parse_pointtest_cold_8();
        output_00 = output;
LAB_00151717:
        psStack_2b8 = (secp256k1_scalar *)0x15171c;
        ec_pubkey_parse_pointtest_cold_5();
LAB_0015171c:
        psStack_2b8 = (secp256k1_scalar *)test_sort_helper;
        ec_pubkey_parse_pointtest_cold_9();
        psStack_2b8 = psVar7;
        uStack_2c0 = uVar9;
        psVar11 = &sStack_2e8;
        if (n_pubkeys == 0) {
          psStack_2f0 = (secp256k1_ge *)0x151799;
          secp256k1_ec_pubkey_sort(CTX,(secp256k1_pubkey **)&sStack_2e8,0);
        }
        else {
          sVar6 = 0;
          do {
            sStack_2e8.d[sVar6] =
                 (uint64_t)
                 ((&(psVar13->ecmult_gen_ctx).scalar_offset)[(ge->x).n[sVar6] * 2 + -1].d + 3);
            sVar6 = sVar6 + 1;
          } while (n_pubkeys != sVar6);
          psStack_2f0 = (secp256k1_ge *)0x15175e;
          psVar14 = CTX;
          secp256k1_ec_pubkey_sort(CTX,(secp256k1_pubkey **)&sStack_2e8,n_pubkeys);
          sVar6 = 0;
          do {
            psVar7 = (secp256k1_scalar *)sStack_2e8.d[sVar6];
            lVar5 = 0;
            do {
              cVar1 = *(char *)((long)psVar7->d + lVar5);
              psVar11 = (secp256k1_scalar *)CONCAT71((int7)((ulong)psVar11 >> 8),cVar1);
              if (cVar1 != *(char *)((long)(psVar13->ecmult_gen_ctx).scalar_offset.d + lVar5 + -8))
              {
                psStack_2f0 = (secp256k1_ge *)random_sign;
                test_sort_helper_cold_1();
                psStack_310 = pubkey_00;
                psStack_308 = output_00;
                psStack_300 = psVar13;
                psStack_2f8 = psVar17;
                psStack_2f0 = pubkey;
                do {
                  testutil_random_scalar_order_test(&sStack_338);
                  iVar4 = secp256k1_ecdsa_sig_sign
                                    (&CTX->ecmult_gen_ctx,(secp256k1_scalar *)psVar14,psVar11,seckey
                                     ,psVar7,&sStack_338,in_R8);
                } while (iVar4 == 0);
                return;
              }
              lVar5 = lVar5 + 1;
            } while (lVar5 != 0x40);
            sVar6 = sVar6 + 1;
            psVar13 = (secp256k1_context *)((psVar13->ecmult_gen_ctx).ge_offset.x.n + 3);
          } while (sVar6 != n_pubkeys);
        }
        return;
      }
      auStack_1f0._0_8_ = 0;
      auStack_1f0._8_8_ = 0;
      auStack_1f0._16_8_ = 0;
      auStack_1f0._24_8_ = 0;
      auStack_1f0._32_8_ = 0;
      auStack_1f0._40_4_ = 0;
      auStack_1f0._44_4_ = 0;
      auStack_1f0._48_8_ = 0;
      auStack_1f0._56_8_ = 0;
      stack0xfffffffffffffda0 = (_func_void_char_ptr_void_ptr *)0x4d430001;
      psVar11 = (secp256k1_scalar *)0x0;
      pubkey = (secp256k1_ge *)auStack_1f0;
      uStack_250 = 0x40;
      uStack_248._0_4_ = 0;
      uStack_248._4_4_ = 0;
      uStack_240._0_4_ = 0;
      uStack_240._4_4_ = 0;
      uStack_238 = 0;
      auStack_2a0._0_8_ = 0;
      psStack_2b8 = (secp256k1_scalar *)0x1511c6;
      ge = pubkey;
      psStack_258 = pubkey;
      iVar4 = secp256k1_ec_pubkey_parse
                        (CTX,(secp256k1_pubkey *)pubkey,auStack_1f0 + 0x40,sStack_210);
      psVar7 = psVar11;
      if (iVar4 == 0) {
LAB_001516e0:
        psStack_2b8 = (secp256k1_scalar *)0x1516e5;
        ec_pubkey_parse_pointtest_cold_14();
        psVar11 = psVar7;
LAB_001516e5:
        psStack_2b8 = (secp256k1_scalar *)0x1516ea;
        ec_pubkey_parse_pointtest_cold_13();
        psVar7 = psVar11;
LAB_001516ea:
        psStack_2b8 = (secp256k1_scalar *)0x1516ef;
        ec_pubkey_parse_pointtest_cold_2();
        goto LAB_001516ef;
      }
      stack0xfffffffffffffda0 = (_func_void_char_ptr_void_ptr *)0x4d430005;
      uStack_250 = 0x40;
      uStack_248._0_4_ = 0;
      uStack_248._4_4_ = 0;
      uStack_240._0_4_ = 0;
      uStack_240._4_4_ = 0;
      uStack_238 = 0;
      auStack_2a0._48_8_ = 0x41;
      auStack_2a0._0_8_ = 0x4d430001;
      auStack_2a0._16_8_ = 0x41;
      auStack_2a0._24_8_ = 0;
      auStack_2a0._32_8_ = 0;
      auStack_2a0._40_4_ = 0;
      auStack_2a0._44_4_ = 0;
      uStack_2a8 = 0;
      in_R8 = (int *)&DAT_00000102;
      psStack_2b8 = (secp256k1_scalar *)0x151283;
      ge = output;
      psVar13 = CTX;
      auStack_2a0._8_8_ = output;
      psStack_258 = pubkey;
      iVar4 = secp256k1_ec_pubkey_serialize
                        (CTX,(uchar *)output,(size_t *)(auStack_2a0 + 0x30),
                         (secp256k1_pubkey *)pubkey,0x102);
      psVar7 = psStack_200;
      if (iVar4 == 0) goto LAB_001516e5;
      auStack_2a0._0_8_ = 0x4d430005;
      auStack_2a0._8_8_ = output;
      auStack_2a0._16_8_ = auStack_2a0._48_8_;
      auStack_2a0._24_8_ = 0;
      auStack_2a0._32_8_ = 0;
      auStack_2a0._40_4_ = 0;
      auStack_2a0._44_4_ = 0;
      uVar2 = (ulong)((long)psVar13 << 3) >> 0x33;
      uVar3 = (((long)psVar13 << 3 | (ulong)psVar13 >> 0x3d) << 0xd | uVar2) >> 3;
      psVar13 = (secp256k1_context *)(uVar3 << 0x33 | (uVar2 << 0x3d | uVar3) >> 0xd);
      uStack_2a8 = 0;
      pubkey = (secp256k1_ge *)0x0;
      if (auStack_2a0._48_8_ != 0x21) goto LAB_001516f4;
      lVar5 = 1;
      do {
        output_00 = output;
        if (auStack_2a0[lVar5 + 0x40] != auStack_1f0[lVar5 + 0x40]) goto LAB_00151717;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x21);
      if ((sStack_210 == 0x21) && (auStack_2a0[0x40] != auStack_1f0[0x40])) goto LAB_001516f9;
      pubkey_00 = (secp256k1_ge *)auStack_1f0;
      if (bVar15 != 0) {
        if (auStack_2a0[0x40] != (char)uVar16) goto LAB_001516fe;
        psStack_2b8 = (secp256k1_scalar *)0x151361;
        ge = &sStack_160;
        psVar13 = CTX;
        iVar4 = secp256k1_pubkey_load(CTX,&sStack_160,(secp256k1_pubkey *)pubkey_00);
        output_00 = &sStack_160;
        if (iVar4 == 0) goto LAB_00151703;
        auStack_1f0._48_8_ = 0;
        auStack_1f0._56_8_ = 0;
        auStack_1f0._32_8_ = 0;
        auStack_1f0._40_4_ = 0;
        auStack_1f0._44_4_ = 0;
        auStack_1f0._16_8_ = 0;
        auStack_1f0._24_8_ = 0;
        auStack_1f0._0_8_ = 0;
        auStack_1f0._8_8_ = 0;
        auStack_2a0._0_8_ = 0x4d430001;
        auStack_2a0._16_8_ = 0x40;
        auStack_2a0._24_8_ = 0;
        auStack_2a0._32_8_ = 0;
        auStack_2a0._40_4_ = 0;
        auStack_2a0._44_4_ = 0;
        output = (secp256k1_ge *)auStack_2a0;
        uStack_2a8 = 0;
        psStack_2b8 = (secp256k1_scalar *)0x1513e6;
        auStack_2a0._8_8_ = pubkey_00;
        secp256k1_ge_to_bytes((uchar *)pubkey_00,&sStack_160);
        auStack_2a0._48_8_ = 0x41;
        auStack_2a0._0_8_ = 0x4d430001;
        output_00 = (secp256k1_ge *)(auStack_2a0 + 0x40);
        auStack_2a0._16_8_ = 0x41;
        auStack_2a0._24_8_ = 0;
        auStack_2a0._32_8_ = 0;
        auStack_2a0._40_4_ = 0;
        auStack_2a0._44_4_ = 0;
        uStack_2a8 = 0;
        in_R8 = (int *)0x2;
        psStack_2b8 = (secp256k1_scalar *)0x1514a0;
        ge = output_00;
        psVar13 = CTX;
        auStack_2a0._8_8_ = output_00;
        iVar4 = secp256k1_ec_pubkey_serialize
                          (CTX,(uchar *)output_00,(size_t *)(auStack_2a0 + 0x30),
                           (secp256k1_pubkey *)pubkey_00,2);
        if (iVar4 == 0) goto LAB_00151708;
        auStack_2a0._0_8_ = 0x4d430005;
        auStack_2a0._8_8_ = output_00;
        auStack_2a0._16_8_ = auStack_2a0._48_8_;
        auStack_2a0._24_8_ = 0;
        auStack_2a0._32_8_ = 0;
        auStack_2a0._40_4_ = 0;
        auStack_2a0._44_4_ = 0;
        uVar2 = (ulong)((long)psVar13 << 3) >> 0x33;
        uVar3 = (((long)psVar13 << 3 | (ulong)psVar13 >> 0x3d) << 0xd | uVar2) >> 3;
        psVar13 = (secp256k1_context *)(uVar3 << 0x33 | (uVar2 << 0x3d | uVar3) >> 0xd);
        uStack_2a8 = 0;
        if (auStack_2a0._48_8_ == 0x41) {
          psVar17 = output_00;
          if (auStack_2a0[0x40] != '\x04') goto LAB_00151712;
          lVar5 = 0;
          do {
            if (acStack_25f[lVar5] != *(char *)((long)psVar7->d + lVar5)) goto LAB_0015171c;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 0x40);
          goto LAB_0015168f;
        }
        goto LAB_0015170d;
      }
LAB_0015168f:
      psVar11 = (secp256k1_scalar *)auStack_1f0;
      uVar9 = (ulong)(uVar8 + 1);
    } while (uVar8 + 1 != 0x100);
    sStack_210 = sStack_210 + 1;
    if (sStack_210 == 0x42) {
      return;
    }
  } while( true );
}

Assistant:

static void test_scalar_split(const secp256k1_scalar* full) {
    secp256k1_scalar s, s1, slam;
    const unsigned char zero[32] = {0};
    unsigned char tmp[32];

    secp256k1_scalar_split_lambda(&s1, &slam, full);

    /* check slam*lambda + s1 == full */
    secp256k1_scalar_mul(&s, &secp256k1_const_lambda, &slam);
    secp256k1_scalar_add(&s, &s, &s1);
    CHECK(secp256k1_scalar_eq(&s, full));

    /* check that both are <= 128 bits in size */
    if (secp256k1_scalar_is_high(&s1)) {
        secp256k1_scalar_negate(&s1, &s1);
    }
    if (secp256k1_scalar_is_high(&slam)) {
        secp256k1_scalar_negate(&slam, &slam);
    }

    secp256k1_scalar_get_b32(tmp, &s1);
    CHECK(secp256k1_memcmp_var(zero, tmp, 16) == 0);
    secp256k1_scalar_get_b32(tmp, &slam);
    CHECK(secp256k1_memcmp_var(zero, tmp, 16) == 0);
}